

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DateImplementation.cpp
# Opt level: O2

JavascriptString * Js::DateImplementation::GetDateGmtString(YMD *pymd,ScriptContext *scriptContext)

{
  ulong uVar1;
  CompoundString *this;
  YMD *pYVar2;
  int local_3c;
  short local_38;
  undefined2 local_36;
  int positiveYear;
  
  this = CompoundString::NewWithCharCapacity
                   (0x1e,(scriptContext->super_ScriptContextBase).javascriptLibrary);
  CompoundString::AppendChars<4u>(this,(char16 (*) [4])(g_rgpszDay + (long)pymd->wday * 8),true);
  CompoundString::AppendChars<3u>(this,(char16 (*) [3])0xe60898,true);
  local_38 = (short)pymd->mday + 1;
  CompoundString::
  AppendChars<unsigned_short,Js::DateImplementation::GetDateGmtString(PlatformAgnostic::DateTime::YMD*,Js::ScriptContext*)::__0>
            (this);
  CompoundString::AppendChars(this,L' ');
  CompoundString::AppendChars<4u>(this,(char16 (*) [4])(g_rgpszMonth + (long)pymd->mon * 8),true);
  CompoundString::AppendChars(this,L' ');
  pYVar2 = pymd;
  if (pymd->year < 1) {
    local_3c = -pymd->year;
    CompoundString::AppendChars(this,L'-');
    pYVar2 = (YMD *)&local_3c;
  }
  CompoundString::AppendChars<int,Js::__4>(this,pYVar2);
  CompoundString::AppendChars(this,L' ');
  local_36 = (undefined2)(pymd->time / 3600000);
  CompoundString::
  AppendChars<unsigned_short,Js::DateImplementation::GetDateGmtString(PlatformAgnostic::DateTime::YMD*,Js::ScriptContext*)::__0>
            (this,&local_36,(long)pymd->time % 3600000 & 0xffffffff);
  CompoundString::AppendChars(this,L':');
  uVar1 = (long)pymd->time / 60000;
  positiveYear._0_2_ =
       (undefined2)((long)((ulong)(uint)((int)uVar1 >> 0x1f) << 0x20 | uVar1 & 0xffffffff) % 0x3c);
  CompoundString::
  AppendChars<unsigned_short,Js::DateImplementation::GetDateGmtString(PlatformAgnostic::DateTime::YMD*,Js::ScriptContext*)::__0>
            (this);
  CompoundString::AppendChars(this,L':');
  uVar1 = (long)pymd->time / 1000;
  positiveYear._2_2_ =
       (undefined2)((long)((ulong)(uint)((int)uVar1 >> 0x1f) << 0x20 | uVar1 & 0xffffffff) % 0x3c);
  CompoundString::
  AppendChars<unsigned_short,Js::DateImplementation::GetDateGmtString(PlatformAgnostic::DateTime::YMD*,Js::ScriptContext*)::__0>
            (this);
  CompoundString::AppendChars(this,L' ');
  CompoundString::AppendChars<4u>(this,(char16 (*) [4])0xf6ce1e,true);
  return (JavascriptString *)this;
}

Assistant:

JavascriptString*
    DateImplementation::GetDateGmtString(DateTime::YMD *pymd,ScriptContext* scriptContext)
    {
        // toUTCString() or toGMTString() will return for example:
        //  "Thu, 02 Feb 2012 09:02:03 GMT" for versions IE11 or above

        CompoundString *const bs = CompoundString::NewWithCharCapacity(30, scriptContext->GetLibrary());

        const auto ConvertUInt16ToString_ZeroPad_2 = [](const uint16 value, char16 *const buffer, const CharCount charCapacity)
        {
            const charcount_t cchWritten = NumberUtilities::UInt16ToString(value, buffer, charCapacity, 2);
            Assert(cchWritten != 0);
        };
        const auto ConvertLongToString = [](const int32 value, char16 *const buffer, const CharCount charCapacity)
        {
            const errno_t err = _ltow_s(value, buffer, charCapacity, 10);
            Assert(err == 0);
        };

        bs->AppendChars(g_rgpszDay[pymd->wday]);
        bs->AppendChars(_u(", "));
        // sz - as %02d - output is "01" to "31"
        bs->AppendChars(static_cast<WORD>(pymd->mday + 1), 2, ConvertUInt16ToString_ZeroPad_2);
        bs->AppendChars(_u(' '));
        bs->AppendChars(g_rgpszMonth[pymd->mon]);
        bs->AppendChars(_u(' '));

        // Add the year.
        if ((pymd->year) > 0)
        {
            bs->AppendChars(pymd->year, 10, ConvertUInt32ToString_ZeroPad_4);
        }
        else
        {
            int positiveYear = -(pymd->year); // pymd->year is negative
            bs->AppendChars(_u('-'));
            bs->AppendChars(positiveYear, 10, ConvertUInt32ToString_ZeroPad_4);
        }

        // Add the time.
        bs->AppendChars(_u(' '));
        // sz - as %02d - HOUR
        bs->AppendChars(static_cast<WORD>(pymd->time / 3600000), 2, ConvertUInt16ToString_ZeroPad_2);
        bs->AppendChars(_u(':'));
        // sz - as %02d - MINUTE
        bs->AppendChars(static_cast<WORD>((pymd->time / 60000) % 60), 2, ConvertUInt16ToString_ZeroPad_2);
        bs->AppendChars(_u(':'));
        // sz - as %02d - SECOND
        bs->AppendChars(static_cast<WORD>((pymd->time / 1000) % 60), 2, ConvertUInt16ToString_ZeroPad_2);
        bs->AppendChars(_u(' '));

        bs->AppendChars(_u("GMT"));

        return bs;
    }